

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExperimental.cxx
# Opt level: O0

bool cmExperimental::HasSupportEnabled(cmMakefile *mf,Feature f)

{
  string_view r;
  bool bVar1;
  FeatureData *pFVar2;
  cmValue l;
  cmValue value;
  FeatureData *data;
  bool enabled;
  Feature f_local;
  cmMakefile *mf_local;
  
  pFVar2 = anon_unknown.dwarf_dc0831::DataForFeature(f);
  l = cmMakefile::GetDefinition(mf,&pFVar2->Variable);
  r = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pFVar2->Uuid)
  ;
  bVar1 = ::operator==(l,r);
  if ((bVar1) && ((pFVar2->Warned & 1U) == 0)) {
    cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&pFVar2->Description);
    pFVar2->Warned = true;
  }
  return bVar1;
}

Assistant:

bool cmExperimental::HasSupportEnabled(cmMakefile const& mf, Feature f)
{
  bool enabled = false;
  auto& data = ::DataForFeature(f);

  auto value = mf.GetDefinition(data.Variable);
  if (value == data.Uuid) {
    enabled = true;
  }

  if (enabled && !data.Warned) {
    mf.IssueMessage(MessageType::AUTHOR_WARNING, data.Description);
    data.Warned = true;
  }

  return enabled;
}